

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  Pair *it;
  Pair local_28;
  
  it = LowerBound(&this->Data,key);
  if ((it == (this->Data).Data + (this->Data).Size) || (it->key != key)) {
    local_28.key = key;
    local_28.field_1.val_i = default_val;
    it = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it,&local_28);
  }
  return (int *)&it->field_1;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_i;
}